

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyUtils.cpp
# Opt level: O0

bool isGlobalName(string *name,string *curFun)

{
  bool bVar1;
  string local_60;
  string local_40;
  pair<bool,_int> local_20;
  string *local_18;
  string *curFun_local;
  string *name_local;
  
  local_18 = curFun;
  curFun_local = name;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  std::__cxx11::string::string((string *)&local_60,(string *)curFun);
  local_20 = SymbolTable::getAddr(&symbolTable,&local_40,&local_60);
  bVar1 = local_20.first;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool isGlobalName(string name, string curFun)
{

    return symbolTable.getAddr(name, curFun).first;
}